

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  void *pvVar4;
  
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x7e73f8;
  *(undefined8 *)&this->field_0x180 = 0x7e74c0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0x7e7420;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7e7448;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0x7e7470;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0x7e7498;
  puVar2 = *(undefined1 **)&(this->super_IfcTypeProduct).field_0x158;
  if (puVar2 != &this->field_0x168) {
    operator_delete(puVar2,*(long *)&this->field_0x168 + 1);
  }
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x7e75d8;
  *(undefined8 *)&this->field_0x180 = 0x7e7678;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0x7e7600;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7e7628;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0x7e7650;
  pcVar3 = (this->super_IfcTypeProduct).Tag.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcTypeProduct).Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pvVar4 = *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x100;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&(this->super_IfcTypeProduct).field_0x110 - (long)pvVar4);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,&PTR_construction_vtable_24__007e74e0);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}